

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetReissuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *asset_output_amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *asset_locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *asset_blind_nonce_list,BlindFactor *asset_blind_factor,BlindFactor *entropy)

{
  ByteData256 *__x;
  ByteData *this_00;
  ByteData256 *this_01;
  pointer pAVar1;
  pointer pAVar2;
  Amount *pAVar3;
  Script *pSVar4;
  pointer pCVar5;
  ByteData issuance_amount_rangeproof;
  ByteData inflation_keys_rangeproof;
  _func_int **entropy_00;
  int iVar6;
  value_type_conflict *__val;
  pointer puVar7;
  size_t sVar8;
  size_t sVar9;
  int64_t iVar10;
  CfdException *pCVar11;
  Amount *amount;
  ulong uVar12;
  size_t sVar13;
  Amount *amount_00;
  Script *this_02;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  pointer in_stack_fffffffffffffe18;
  ConfidentialNonce nonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range3;
  int ret;
  ByteData local_168;
  ByteData256 local_150;
  ConfidentialValue local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  ConfidentialValue local_f8;
  ByteData256 local_d0;
  ByteData256 local_b8;
  ByteData256 local_a0;
  ConfidentialValue local_88;
  ByteData local_60;
  ByteData local_48;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)tx_in_index,0x7c8,"SetAssetReissuance");
  ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&nonce,
             &(this->vin_).
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[tx_in_index].inflation_keys_);
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar12 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           CONCAT44(nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    nonce.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_);
  if (uVar12 == 0) {
    puVar7 = (pointer)0x0;
  }
  else {
    if ((long)uVar12 < 0) {
      ::std::__throw_bad_alloc();
    }
    puVar7 = (pointer)operator_new(uVar12);
  }
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar7 + uVar12;
  sVar13 = (long)nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)CONCAT44(nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          nonce.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar7;
  if (sVar13 != 0) {
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
    memmove(puVar7,(void *)CONCAT44(nonce.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    nonce.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_),sVar13);
  }
  asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar7 + sVar13;
  sVar8 = ByteData::GetDataSize((ByteData *)&asset);
  bVar17 = true;
  if (sVar8 == 0) {
    ConfidentialValue::ConfidentialValue
              (&local_138,
               &(this->vin_).
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[tx_in_index].issuance_amount_);
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar12 = (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar12 == 0) {
      puVar7 = (pointer)0x0;
    }
    else {
      if ((long)uVar12 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar7 = (pointer)operator_new(uVar12);
    }
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar7 + uVar12;
    sVar13 = (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_138.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar7;
    if (sVar13 != 0) {
      local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7;
      memmove(puVar7,local_138.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar13);
    }
    local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7 + sVar13;
    sVar9 = ByteData::GetDataSize(&local_168);
    bVar17 = sVar9 != 0;
  }
  if (sVar8 == 0) {
    if (local_168.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_138._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
    if (local_138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if ((void *)CONCAT44(nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       nonce.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     nonce.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if (bVar17) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7cc;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"already set to reissue parameter"
                 );
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"already set to reissue parameter","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar10 = Amount::GetSatoshiValue(asset_amount);
  if (iVar10 < 1) {
    nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7d2;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                  "ReIssuance must have one non-zero amount.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&nonce,"ReIssuance must have one non-zero amount.","");
    CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&nonce);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pAVar1 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar2 = (asset_output_amount_list->
           super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pAVar1 == pAVar2) ==
      ((asset_locking_script_list->
       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
       super__Vector_impl_data._M_start ==
      (asset_locking_script_list->
      super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    if (pAVar1 != pAVar2) {
      Amount::Amount((Amount *)&asset);
      amount_00 = (asset_output_amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start;
      pAVar3 = (asset_output_amount_list->
               super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (amount_00 != pAVar3) {
        do {
          Amount::operator+=((Amount *)&asset,amount_00);
          amount_00 = amount_00 + 1;
        } while (amount_00 != pAVar3);
      }
      bVar17 = Amount::operator!=((Amount *)&asset,asset_amount);
      if (bVar17) {
        nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x7e4;
        nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = "SetAssetReissuance";
        logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,"Unmatch asset amount.");
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        nonce._vptr_ConfidentialNonce =
             (_func_int **)
             &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&nonce,"Unmatch asset amount.","");
        CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&nonce);
        __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pSVar4 = (asset_locking_script_list->
               super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (asset_locking_script_list->
                     super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                     _M_impl.super__Vector_impl_data._M_start; this_02 != pSVar4;
          this_02 = this_02 + 1) {
        bVar17 = Script::IsEmpty(this_02);
        if (bVar17) {
          nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x7e9;
          nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = "SetAssetReissuance";
          logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                        "Empty locking script from asset.");
          pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
          nonce._vptr_ConfidentialNonce =
               (_func_int **)
               &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&nonce,"Empty locking script from asset.","");
          CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&nonce);
          __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
        }
      }
    }
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x20;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    __x = &entropy->data_;
    asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_150.data_,&__x->data_);
    ByteData256::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&nonce,&local_150);
    entropy_00 = nonce._vptr_ConfidentialNonce;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_a0.data_,&__x->data_);
    ByteData256::GetBytes(&local_110,&local_a0);
    iVar6 = wally_tx_elements_issuance_calculate_asset
                      ((uchar *)entropy_00,
                       (long)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_110.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (nonce._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(nonce._vptr_ConfidentialNonce);
    }
    if (local_150.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ret = iVar6;
    if (iVar6 == 0) {
      (__return_storage_ptr__->entropy)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_006a24b0
      ;
      this_01 = &(__return_storage_ptr__->entropy).data_;
      ByteData256::ByteData256(this_01);
      (__return_storage_ptr__->asset)._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
      this_00 = &(__return_storage_ptr__->asset).data_;
      ByteData::ByteData(this_00);
      (__return_storage_ptr__->asset).version_ = '\0';
      (__return_storage_ptr__->token)._vptr_ConfidentialAssetId =
           (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
      ByteData::ByteData(&(__return_storage_ptr__->token).data_);
      (__return_storage_ptr__->token).version_ = '\0';
      if (__return_storage_ptr__ != (IssuanceParameter *)entropy) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this_01->data_,&__x->data_);
      }
      ByteData::ByteData((ByteData *)&local_150,&asset);
      ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&nonce,(ByteData *)&local_150)
      ;
      if (&__return_storage_ptr__->asset != (ConfidentialAssetId *)&nonce) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this_00->data_,&nonce.data_.data_);
        (__return_storage_ptr__->asset).version_ = nonce.version_;
      }
      nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
      if ((void *)CONCAT44(nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,
                           nonce.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         nonce.data_.data_.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_));
      }
      if (local_150.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b8.data_,&(asset_blind_factor->data_).data_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_d0.data_,&__x->data_);
      ConfidentialValue::ConfidentialValue(&local_88,asset_amount);
      local_f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
      ByteData::ByteData(&local_f8.data_);
      local_f8.version_ = '\0';
      ByteData::ByteData(&local_48);
      ByteData::ByteData(&local_60);
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_48;
      issuance_amount_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe18;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._0_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)nonce._vptr_ConfidentialNonce;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start._4_4_;
      inflation_keys_rangeproof.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      SetIssuance(this,tx_in_index,&local_b8,&local_d0,&local_88,&local_f8,
                  issuance_amount_rangeproof,inflation_keys_rangeproof);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_f8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
      if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_88._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
      if (local_88.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_start !=
          (asset_output_amount_list->
          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar10 = Amount::GetSatoshiValue(asset_amount);
        if ((0 < iVar10) &&
           ((asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (asset_output_amount_list->
            super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl.
            super__Vector_impl_data._M_start)) {
          lVar14 = 0;
          lVar15 = 0;
          lVar16 = 0;
          uVar12 = 0;
          do {
            nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_006a23c0;
            ByteData::ByteData(&nonce.data_);
            nonce.version_ = '\0';
            pCVar5 = (asset_blind_nonce_list->
                     super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if ((uVar12 < (ulong)(((long)(asset_blind_nonce_list->
                                         super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5
                                  >> 3) * -0x3333333333333333)) &&
               ((ConfidentialNonce *)((long)&pCVar5->_vptr_ConfidentialNonce + lVar16) != &nonce)) {
              ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&nonce.data_.data_,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&(pCVar5->data_).data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar16));
              nonce.version_ = (&pCVar5->version_)[lVar16];
            }
            AddTxOut(this,(Amount *)
                          ((long)&((asset_output_amount_list->
                                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->amount_ + lVar15),
                     &__return_storage_ptr__->asset,
                     (Script *)
                     ((long)&((asset_locking_script_list->
                              super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar14),
                     &nonce);
            nonce._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_006a23c0;
            if ((void *)CONCAT44(nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 nonce.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
              operator_delete((void *)CONCAT44(nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               nonce.data_.data_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_));
            }
            uVar12 = uVar12 + 1;
            lVar16 = lVar16 + 0x28;
            lVar15 = lVar15 + 0x10;
            lVar14 = lVar14 + 0x38;
          } while (uVar12 < (ulong)((long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(asset_output_amount_list->
                                          super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 4));
        }
      }
      if (asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(asset.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7f6;
    nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "SetAssetReissuance";
    logger::log<int&>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                      "wally_tx_elements_issuance_calculate_asset NG[{}].",&ret);
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    nonce._vptr_ConfidentialNonce =
         (_func_int **)
         &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&nonce,"asset calculate error.","");
    CfdException::CfdException(pCVar11,kCfdIllegalStateError,(string *)&nonce);
    __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
  }
  nonce._vptr_ConfidentialNonce = (_func_int **)0x59e1e8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7d8;
  nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "SetAssetReissuance";
  logger::log<>((CfdSourceLocation *)&nonce,kCfdLogLevelWarning,
                "Unmatch count. asset amount list and locking script list.");
  pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
  nonce._vptr_ConfidentialNonce =
       (_func_int **)
       &nonce.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nonce,"Unmatch count. asset amount list and locking script list.","");
  CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)&nonce);
  __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetReissuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const std::vector<Amount> &asset_output_amount_list,
    const std::vector<Script> &asset_locking_script_list,
    const std::vector<ConfidentialNonce> &asset_blind_nonce_list,
    const BlindFactor &asset_blind_factor, const BlindFactor &entropy) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  if ((vin_[tx_in_index].GetInflationKeys().GetData().GetDataSize() > 0) ||
      (vin_[tx_in_index].GetIssuanceAmount().GetData().GetDataSize() > 0)) {
    warn(CFD_LOG_SOURCE, "already set to reissue parameter");
    throw CfdException(
        kCfdIllegalArgumentError, "already set to reissue parameter");
  }

  if (asset_amount.GetSatoshiValue() <= 0) {
    warn(CFD_LOG_SOURCE, "ReIssuance must have one non-zero amount.");
    throw CfdException(
        kCfdIllegalArgumentError, "ReIssuance must have one non-zero amount.");
  }
  if (asset_output_amount_list.empty() != asset_locking_script_list.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch count. asset amount list and locking script list.");
    throw CfdException(
        kCfdIllegalArgumentError,
        "Unmatch count. asset amount list and locking script list.");
  }
  if (!asset_output_amount_list.empty()) {
    Amount total;
    for (const auto &amount : asset_output_amount_list) {
      total += amount;
    }
    if (total != asset_amount) {
      warn(CFD_LOG_SOURCE, "Unmatch asset amount.");
      throw CfdException(kCfdIllegalArgumentError, "Unmatch asset amount.");
    }
    for (const auto &script : asset_locking_script_list) {
      if (script.IsEmpty()) {
        warn(CFD_LOG_SOURCE, "Empty locking script from asset.");
        throw CfdException(
            kCfdIllegalArgumentError, "Empty locking script from asset.");
      }
    }
  }

  std::vector<uint8_t> asset(kAssetSize);
  int ret = wally_tx_elements_issuance_calculate_asset(
      entropy.GetData().GetBytes().data(), entropy.GetData().GetBytes().size(),
      asset.data(), asset.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_issuance_calculate_asset NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "asset calculate error.");
  }

  IssuanceParameter param;
  param.entropy = entropy;
  param.asset = ConfidentialAssetId(ByteData(asset));
  SetIssuance(
      tx_in_index, asset_blind_factor.GetData(), entropy.GetData(),
      ConfidentialValue(asset_amount), ConfidentialValue(), ByteData(),
      ByteData());

  if ((!asset_output_amount_list.empty()) &&
      (asset_amount.GetSatoshiValue() > 0)) {
    for (size_t index = 0; index < asset_output_amount_list.size(); ++index) {
      ConfidentialNonce nonce;
      if (index < asset_blind_nonce_list.size()) {
        nonce = asset_blind_nonce_list[index];
      }
      AddTxOut(
          asset_output_amount_list[index], param.asset,
          asset_locking_script_list[index], nonce);
    }
  }
  return param;
}